

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

CURLcode singleipconnect(connectdata *conn,Curl_addrinfo *ai,curl_socket_t *sockp)

{
  curl_sockopt_callback p_Var1;
  Curl_easy *pCVar2;
  long lVar3;
  _Bool _Var4;
  ushort uVar5;
  CURLcode CVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  if2ip_result_t iVar10;
  size_t sVar11;
  uint *puVar12;
  int *piVar13;
  undefined4 uVar14;
  ulong uVar15;
  char *pcVar16;
  char *fmt;
  curl_socket_t __fd;
  socklen_t __len;
  byte *__s;
  int iVar17;
  Curl_easy *pCVar18;
  timeval tVar19;
  curl_socket_t sockfd;
  Curl_easy *local_2c0;
  curl_socket_t local_2b8;
  undefined4 local_2b4;
  Curl_dns_entry *h;
  uint local_2a4;
  curl_socket_t *local_2a0;
  Curl_easy *local_298;
  socklen_t local_28c;
  Curl_sockaddr_storage sa;
  long port;
  char ipaddress [46];
  Curl_sockaddr_ex addr;
  char myhost [256];
  
  pCVar18 = conn->data;
  *sockp = -1;
  CVar6 = Curl_socket(conn,ai,&addr,&sockfd);
  if (CVar6 != CURLE_OK) {
    return CURLE_OK;
  }
  _Var4 = getaddressinfo(&addr._sa_ex_u.addr,ipaddress,&port);
  if (!_Var4) {
    puVar12 = (uint *)__errno_location();
    uVar8 = *puVar12;
    pcVar16 = Curl_strerror(conn,uVar8);
    Curl_failf(pCVar18,"sa_addr inet_ntop() failed with errno %d: %s",(ulong)uVar8,pcVar16);
    Curl_closesocket(conn,sockfd);
    return CURLE_OK;
  }
  Curl_infof(pCVar18,"  Trying %s...\n",ipaddress);
  __fd = sockfd;
  if ((addr.family == 2) && (addr.socktype == 1)) {
    if ((pCVar18->set).tcp_nodelay == true) {
      Curl_tcpnodelay(conn,sockfd);
    }
    if ((pCVar18->set).tcp_keepalive == true) {
      myhost[0] = '\x01';
      myhost[1] = '\0';
      myhost[2] = '\0';
      myhost[3] = '\0';
      iVar7 = setsockopt(__fd,1,9,myhost,4);
      if (iVar7 < 0) {
        pcVar16 = "Failed to set SO_KEEPALIVE on fd %d\n";
      }
      else {
        iVar7 = curlx_sltosi((pCVar18->set).tcp_keepidle);
        myhost[0] = (char)iVar7;
        myhost[1] = (char)((uint)iVar7 >> 8);
        myhost[2] = (char)((uint)iVar7 >> 0x10);
        myhost[3] = (char)((uint)iVar7 >> 0x18);
        iVar7 = setsockopt(__fd,6,4,myhost,4);
        if (iVar7 < 0) {
          Curl_infof(pCVar18,"Failed to set TCP_KEEPIDLE on fd %d\n",(ulong)(uint)__fd);
        }
        iVar7 = curlx_sltosi((pCVar18->set).tcp_keepintvl);
        myhost[0] = (char)iVar7;
        myhost[1] = (char)((uint)iVar7 >> 8);
        myhost[2] = (char)((uint)iVar7 >> 0x10);
        myhost[3] = (char)((uint)iVar7 >> 0x18);
        iVar7 = setsockopt(__fd,6,5,myhost,4);
        if (-1 < iVar7) goto LAB_004b040b;
        pcVar16 = "Failed to set TCP_KEEPINTVL on fd %d\n";
      }
      Curl_infof(pCVar18,pcVar16,(ulong)(uint)__fd);
    }
  }
LAB_004b040b:
  p_Var1 = (pCVar18->set).fsockopt;
  if ((p_Var1 == (curl_sockopt_callback)0x0) ||
     (iVar7 = (*p_Var1)((pCVar18->set).sockopt_client,__fd,CURLSOCKTYPE_IPCXN), iVar7 == 0)) {
    uVar14 = 0;
  }
  else {
    uVar14 = 1;
    if (iVar7 != 2) {
      Curl_closesocket(conn,__fd);
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }
  if (addr.family != 2) goto LAB_004b07d7;
  local_2b8 = __fd;
  local_2b4 = uVar14;
  uVar8 = Curl_ipv6_scope(&addr._sa_ex_u.addr);
  pCVar2 = conn->data;
  h = (Curl_dns_entry *)0x0;
  uVar5 = (pCVar2->set).localport;
  uVar15 = (ulong)uVar5;
  __s = (byte *)(pCVar2->set).str[8];
  __fd = local_2b8;
  uVar14 = local_2b4;
  if (uVar5 == 0 && __s == (byte *)0x0) goto LAB_004b07d7;
  iVar7 = (pCVar2->set).localportrange;
  sa.buffer._112_8_ = 0;
  sa.buffer.sa_stor.__ss_align = 0;
  sa.buffer._96_8_ = 0;
  sa.buffer._104_8_ = 0;
  sa.buffer._80_8_ = 0;
  sa.buffer._88_8_ = 0;
  sa.buffer._64_8_ = 0;
  sa.buffer._72_8_ = 0;
  sa.buffer._48_8_ = 0;
  sa.buffer._56_8_ = 0;
  sa.buffer._32_8_ = 0;
  sa.buffer._40_8_ = 0;
  sa.buffer._16_8_ = 0;
  sa.buffer._24_8_ = 0;
  sa.buffer._0_8_ = 0;
  sa.buffer._8_1_ = '\0';
  sa.buffer._9_1_ = '\0';
  sa.buffer._10_1_ = '\0';
  sa.buffer._11_1_ = '\0';
  sa.buffer._12_1_ = '\0';
  sa.buffer._13_1_ = '\0';
  sa.buffer._14_1_ = '\0';
  sa.buffer._15_1_ = '\0';
  local_2c0 = pCVar2;
  local_2a4 = uVar8;
  local_2a0 = sockp;
  local_298 = pCVar18;
  if ((__s == (byte *)0x0) || (sVar11 = strlen((char *)__s), 0xfe < sVar11)) {
LAB_004b06ed:
    sa.buffer.sa_in.sin_port = uVar5 << 8 | uVar5 >> 8;
    sa.buffer.sa.sa_family = 2;
    __len = 0x10;
LAB_004b0703:
    while( true ) {
      iVar17 = bind(local_2b8,(sockaddr *)&sa,__len);
      uVar15 = uVar15 & 0xffff;
      if (-1 < iVar17) break;
      if (iVar7 < 2) {
        puVar12 = (uint *)__errno_location();
        pCVar18 = local_2c0;
        uVar8 = *puVar12;
        (local_2c0->state).os_errno = uVar8;
        pcVar16 = Curl_strerror(conn,uVar8);
        fmt = "bind failed with errno %d: %s";
        goto LAB_004b08fe;
      }
      Curl_infof(local_2c0,"Bind to local port %hu failed, trying next\n",uVar15);
      uVar8 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar8;
      if (sa.buffer.sa.sa_family == 2) {
        uVar5 = (ushort)uVar8;
        sa.buffer.sa_in.sin_port = uVar5 << 8 | uVar5 >> 8;
        sa.buffer.sa.sa_family = 2;
      }
      iVar7 = iVar7 + -1;
    }
    local_28c = 0x80;
    myhost[0] = '\0';
    myhost[1] = '\0';
    myhost[2] = '\0';
    myhost[3] = '\0';
    myhost[4] = '\0';
    myhost[5] = '\0';
    myhost[6] = '\0';
    myhost[7] = '\0';
    myhost[8] = '\0';
    myhost[9] = '\0';
    myhost[10] = '\0';
    myhost[0xb] = '\0';
    myhost[0xc] = '\0';
    myhost[0xd] = '\0';
    myhost[0xe] = '\0';
    myhost[0xf] = '\0';
    myhost[0x10] = '\0';
    myhost[0x11] = '\0';
    myhost[0x12] = '\0';
    myhost[0x13] = '\0';
    myhost[0x14] = '\0';
    myhost[0x15] = '\0';
    myhost[0x16] = '\0';
    myhost[0x17] = '\0';
    myhost[0x18] = '\0';
    myhost[0x19] = '\0';
    myhost[0x1a] = '\0';
    myhost[0x1b] = '\0';
    myhost[0x1c] = '\0';
    myhost[0x1d] = '\0';
    myhost[0x1e] = '\0';
    myhost[0x1f] = '\0';
    myhost[0x20] = '\0';
    myhost[0x21] = '\0';
    myhost[0x22] = '\0';
    myhost[0x23] = '\0';
    myhost[0x24] = '\0';
    myhost[0x25] = '\0';
    myhost[0x26] = '\0';
    myhost[0x27] = '\0';
    myhost[0x28] = '\0';
    myhost[0x29] = '\0';
    myhost[0x2a] = '\0';
    myhost[0x2b] = '\0';
    myhost[0x2c] = '\0';
    myhost[0x2d] = '\0';
    myhost[0x2e] = '\0';
    myhost[0x2f] = '\0';
    myhost[0x30] = '\0';
    myhost[0x31] = '\0';
    myhost[0x32] = '\0';
    myhost[0x33] = '\0';
    myhost[0x34] = '\0';
    myhost[0x35] = '\0';
    myhost[0x36] = '\0';
    myhost[0x37] = '\0';
    myhost[0x38] = '\0';
    myhost[0x39] = '\0';
    myhost[0x3a] = '\0';
    myhost[0x3b] = '\0';
    myhost[0x3c] = '\0';
    myhost[0x3d] = '\0';
    myhost[0x3e] = '\0';
    myhost[0x3f] = '\0';
    myhost[0x40] = '\0';
    myhost[0x41] = '\0';
    myhost[0x42] = '\0';
    myhost[0x43] = '\0';
    myhost[0x44] = '\0';
    myhost[0x45] = '\0';
    myhost[0x46] = '\0';
    myhost[0x47] = '\0';
    myhost[0x48] = '\0';
    myhost[0x49] = '\0';
    myhost[0x4a] = '\0';
    myhost[0x4b] = '\0';
    myhost[0x4c] = '\0';
    myhost[0x4d] = '\0';
    myhost[0x4e] = '\0';
    myhost[0x4f] = '\0';
    myhost[0x50] = '\0';
    myhost[0x51] = '\0';
    myhost[0x52] = '\0';
    myhost[0x53] = '\0';
    myhost[0x54] = '\0';
    myhost[0x55] = '\0';
    myhost[0x56] = '\0';
    myhost[0x57] = '\0';
    myhost[0x58] = '\0';
    myhost[0x59] = '\0';
    myhost[0x5a] = '\0';
    myhost[0x5b] = '\0';
    myhost[0x5c] = '\0';
    myhost[0x5d] = '\0';
    myhost[0x5e] = '\0';
    myhost[0x5f] = '\0';
    myhost[0x60] = '\0';
    myhost[0x61] = '\0';
    myhost[0x62] = '\0';
    myhost[99] = '\0';
    myhost[100] = '\0';
    myhost[0x65] = '\0';
    myhost[0x66] = '\0';
    myhost[0x67] = '\0';
    myhost[0x68] = '\0';
    myhost[0x69] = '\0';
    myhost[0x6a] = '\0';
    myhost[0x6b] = '\0';
    myhost[0x6c] = '\0';
    myhost[0x6d] = '\0';
    myhost[0x6e] = '\0';
    myhost[0x6f] = '\0';
    myhost[0x70] = '\0';
    myhost[0x71] = '\0';
    myhost[0x72] = '\0';
    myhost[0x73] = '\0';
    myhost[0x74] = '\0';
    myhost[0x75] = '\0';
    myhost[0x76] = '\0';
    myhost[0x77] = '\0';
    myhost[0x78] = '\0';
    myhost[0x79] = '\0';
    myhost[0x7a] = '\0';
    myhost[0x7b] = '\0';
    myhost[0x7c] = '\0';
    myhost[0x7d] = '\0';
    myhost[0x7e] = '\0';
    myhost[0x7f] = '\0';
    iVar7 = getsockname(local_2b8,(sockaddr *)myhost,&local_28c);
    if (-1 < iVar7) {
      Curl_infof(local_2c0,"Local port: %hu\n",uVar15);
      (conn->bits).bound = true;
      sockp = local_2a0;
      pCVar18 = local_298;
      __fd = sockfd;
      uVar14 = local_2b4;
LAB_004b07d7:
      curlx_nonblock(__fd,1);
      tVar19 = curlx_tvnow();
      conn->connecttime = tVar19;
      if (1 < conn->num_addr) {
        Curl_expire(pCVar18,conn->timeoutms_per_addr,EXPIRE_DNS_PER_NAME);
      }
      if (((((char)uVar14 == '\0') && (conn->socktype == 1)) &&
          (((conn->bits).tcp_fastopen != true || ((conn->given->flags & 1) != 0)))) &&
         (iVar7 = connect(__fd,(sockaddr *)&addr._sa_ex_u.addr,addr.addrlen), iVar7 == -1)) {
        piVar13 = __errno_location();
        iVar7 = *piVar13;
        if ((iVar7 != 0xb) && (iVar7 != 0x73)) {
          pcVar16 = Curl_strerror(conn,iVar7);
          Curl_infof(pCVar18,"Immediate connect fail for %s: %s\n",ipaddress,pcVar16);
          (pCVar18->state).os_errno = iVar7;
          Curl_closesocket(conn,__fd);
          return CURLE_COULDNT_CONNECT;
        }
      }
      *sockp = __fd;
      return CURLE_OK;
    }
    puVar12 = (uint *)__errno_location();
    pCVar18 = local_2c0;
    uVar8 = *puVar12;
    (local_2c0->state).os_errno = uVar8;
    pcVar16 = Curl_strerror(conn,uVar8);
    fmt = "getsockname() failed with errno %d: %s";
LAB_004b08fe:
    Curl_failf(pCVar18,fmt,(ulong)uVar8,pcVar16);
  }
  else {
    memset(myhost,0,0x100);
    iVar17 = *__s - 0x69;
    if ((iVar17 == 0) && (iVar17 = __s[1] - 0x66, iVar17 == 0)) {
      iVar17 = 0x21 - (uint)__s[2];
    }
    else {
      iVar17 = -iVar17;
    }
    if (iVar17 != 0) {
      iVar9 = strncmp("host!",(char *)__s,5);
      if (iVar9 != 0) goto LAB_004b056f;
      __s = __s + 5;
      goto LAB_004b0646;
    }
    __s = __s + 3;
LAB_004b056f:
    iVar10 = Curl_if2ip(2,local_2a4,conn->scope_id,(char *)__s,myhost,0x100);
    if (iVar10 == IF2IP_FOUND) {
      Curl_infof(local_2c0,"Local Interface %s is ip %s using address family %i\n",__s,myhost,2);
      sVar11 = strlen((char *)__s);
      iVar17 = setsockopt(local_2b8,1,0x19,__s,(int)sVar11 + 1);
      if (iVar17 != 0) {
        puVar12 = (uint *)__errno_location();
        uVar8 = *puVar12;
        pcVar16 = Curl_strerror(conn,uVar8);
        Curl_infof(local_2c0,"SO_BINDTODEVICE %s failed with errno %d: %s; will do regular bind\n",
                   __s,(ulong)uVar8,pcVar16);
      }
LAB_004b06d0:
      iVar17 = inet_pton(2,myhost,(void *)((long)&sa.buffer + 4));
      if (0 < iVar17) goto LAB_004b06ed;
      __len = 0;
      goto LAB_004b0703;
    }
    if (iVar10 == IF2IP_AF_NOT_SUPPORTED) goto LAB_004b0911;
    if (iVar10 == IF2IP_NOT_FOUND) {
      if (iVar17 != 0) {
LAB_004b0646:
        lVar3 = conn->ip_version;
        conn->ip_version = 1;
        Curl_resolv(conn,(char *)__s,0,&h);
        conn->ip_version = lVar3;
        if (h != (Curl_dns_entry *)0x0) {
          Curl_printable_address(h->addr,myhost,0x100);
          pCVar18 = local_2c0;
          Curl_infof(local_2c0,"Name \'%s\' family %i resolved to \'%s\' family %i\n",__s,2,myhost,
                     (ulong)(uint)h->addr->ai_family);
          Curl_resolv_unlock(pCVar18,h);
          goto LAB_004b06d0;
        }
        goto LAB_004b092d;
      }
      pcVar16 = "Couldn\'t bind to interface \'%s\'";
    }
    else {
      if (iVar17 != 0) goto LAB_004b0646;
LAB_004b092d:
      pcVar16 = "Couldn\'t bind to \'%s\'";
    }
    Curl_failf(local_2c0,pcVar16,__s);
  }
  iVar10 = 0x2d;
LAB_004b0911:
  Curl_closesocket(conn,sockfd);
  if (iVar10 == IF2IP_AF_NOT_SUPPORTED) {
    return CURLE_COULDNT_CONNECT;
  }
  return iVar10;
}

Assistant:

static CURLcode singleipconnect(struct connectdata *conn,
                                const Curl_addrinfo *ai,
                                curl_socket_t *sockp)
{
  struct Curl_sockaddr_ex addr;
  int rc = -1;
  int error = 0;
  bool isconnected = FALSE;
  struct Curl_easy *data = conn->data;
  curl_socket_t sockfd;
  CURLcode result;
  char ipaddress[MAX_IPADR_LEN];
  long port;
  bool is_tcp;

  *sockp = CURL_SOCKET_BAD;

  result = Curl_socket(conn, ai, &addr, &sockfd);
  if(result)
    /* Failed to create the socket, but still return OK since we signal the
       lack of socket as well. This allows the parent function to keep looping
       over alternative addresses/socket families etc. */
    return CURLE_OK;

  /* store remote address and port used in this connection attempt */
  if(!getaddressinfo((struct sockaddr*)&addr.sa_addr,
                     ipaddress, &port)) {
    /* malformed address or bug in inet_ntop, try next address */
    error = ERRNO;
    failf(data, "sa_addr inet_ntop() failed with errno %d: %s",
          error, Curl_strerror(conn, error));
    Curl_closesocket(conn, sockfd);
    return CURLE_OK;
  }
  infof(data, "  Trying %s...\n", ipaddress);

#ifdef ENABLE_IPV6
  is_tcp = (addr.family == AF_INET || addr.family == AF_INET6) &&
    addr.socktype == SOCK_STREAM;
#else
  is_tcp = (addr.family == AF_INET) && addr.socktype == SOCK_STREAM;
#endif
  if(is_tcp && data->set.tcp_nodelay)
    Curl_tcpnodelay(conn, sockfd);

  nosigpipe(conn, sockfd);

  Curl_sndbufset(sockfd);

  if(is_tcp && data->set.tcp_keepalive)
    tcpkeepalive(data, sockfd);

  if(data->set.fsockopt) {
    /* activate callback for setting socket options */
    error = data->set.fsockopt(data->set.sockopt_client,
                               sockfd,
                               CURLSOCKTYPE_IPCXN);

    if(error == CURL_SOCKOPT_ALREADY_CONNECTED)
      isconnected = TRUE;
    else if(error) {
      Curl_closesocket(conn, sockfd); /* close the socket and bail out */
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  /* possibly bind the local end to an IP, interface or port */
  if(addr.family == AF_INET
#ifdef ENABLE_IPV6
     || addr.family == AF_INET6
#endif
    ) {
    result = bindlocal(conn, sockfd, addr.family,
                       Curl_ipv6_scope((struct sockaddr*)&addr.sa_addr));
    if(result) {
      Curl_closesocket(conn, sockfd); /* close socket and bail out */
      if(result == CURLE_UNSUPPORTED_PROTOCOL) {
        /* The address family is not supported on this interface.
           We can continue trying addresses */
        return CURLE_COULDNT_CONNECT;
      }
      return result;
    }
  }

  /* set socket non-blocking */
  (void)curlx_nonblock(sockfd, TRUE);

  conn->connecttime = Curl_tvnow();
  if(conn->num_addr > 1)
    Curl_expire(data, conn->timeoutms_per_addr, EXPIRE_DNS_PER_NAME);

  /* Connect TCP sockets, bind UDP */
  if(!isconnected && (conn->socktype == SOCK_STREAM)) {
    if(conn->bits.tcp_fastopen) {
#if defined(CONNECT_DATA_IDEMPOTENT) /* OS X */
      sa_endpoints_t endpoints;
      endpoints.sae_srcif = 0;
      endpoints.sae_srcaddr = NULL;
      endpoints.sae_srcaddrlen = 0;
      endpoints.sae_dstaddr = &addr.sa_addr;
      endpoints.sae_dstaddrlen = addr.addrlen;

      rc = connectx(sockfd, &endpoints, SAE_ASSOCID_ANY,
                    CONNECT_RESUME_ON_READ_WRITE | CONNECT_DATA_IDEMPOTENT,
                    NULL, 0, NULL, NULL);
#elif defined(MSG_FASTOPEN) /* Linux */
      if(conn->given->flags & PROTOPT_SSL)
        rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
      else
        rc = 0; /* Do nothing */
#endif
    }
    else {
      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
    }

    if(-1 == rc)
      error = SOCKERRNO;
  }
  else {
    *sockp = sockfd;
    return CURLE_OK;
  }

#ifdef ENABLE_IPV6
  conn->bits.ipv6 = (addr.family == AF_INET6)?TRUE:FALSE;
#endif

  if(-1 == rc) {
    switch(error) {
    case EINPROGRESS:
    case EWOULDBLOCK:
#if defined(EAGAIN)
#if (EAGAIN) != (EWOULDBLOCK)
      /* On some platforms EAGAIN and EWOULDBLOCK are the
       * same value, and on others they are different, hence
       * the odd #if
       */
    case EAGAIN:
#endif
#endif
      result = CURLE_OK;
      break;

    default:
      /* unknown error, fallthrough and try another address! */
      infof(data, "Immediate connect fail for %s: %s\n",
            ipaddress, Curl_strerror(conn, error));
      data->state.os_errno = error;

      /* connect failed */
      Curl_closesocket(conn, sockfd);
      result = CURLE_COULDNT_CONNECT;
    }
  }

  if(!result)
    *sockp = sockfd;

  return result;
}